

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O1

void __thiscall glu::ContextInfo::ContextInfo(ContextInfo *this,RenderContext *context)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  char *pcVar5;
  long lVar6;
  char *__s;
  long lVar7;
  long lVar8;
  int numExtensions;
  allocator<char> local_91;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_90;
  undefined1 local_88 [32];
  _Base_ptr local_68;
  size_t sStack_60;
  set<int,_std::less<int>,_std::allocator<int>_> *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  this->_vptr_ContextInfo = (_func_int **)&PTR__ContextInfo_021c5210;
  this->m_context = context;
  (this->m_extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._24_8_ = local_88 + 8;
  local_88._16_8_ = (_Base_ptr)0x0;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = 0;
  sStack_60 = 0;
  local_58 = &(this->m_compressedTextureFormats).m_value;
  local_90 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->m_extensions;
  local_68 = (_Base_ptr)local_88._24_8_;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_58->_M_t,
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_88);
  (this->m_compressedTextureFormats).m_isComputed = false;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_88);
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  lVar6 = CONCAT44(extraout_var,iVar2);
  uVar3 = (*context->_vptr_RenderContext[2])(context);
  if ((uVar3 & 0x3ff) == 2) {
    pcVar5 = (char *)(**(code **)(lVar6 + 0xa78))(0x1f03);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    checkError(dVar4,"glGetString(GL_EXTENSIONS) failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluContextInfo.cpp"
               ,0xc1);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pcVar5,&local_91);
    lVar7 = 0;
    lVar6 = std::__cxx11::string::find((char)local_50,0x20);
    if (lVar6 != -1) {
      do {
        std::__cxx11::string::substr((ulong)local_88,(ulong)local_50);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88);
        if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
          operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
        }
        lVar7 = lVar6 + 1;
        lVar6 = std::__cxx11::string::find((char)local_50,0x20);
      } while (lVar6 != -1);
    }
    if (lVar7 != -1) {
      std::__cxx11::string::substr((ulong)local_88,(ulong)local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                (local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_88);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
      }
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  else {
    local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
    (**(code **)(lVar6 + 0x868))(0x821d);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    checkError(dVar4,"glGetIntegerv(GL_NUM_EXTENSIONS) failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluContextInfo.cpp"
               ,0xca);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->m_extensions,(long)(int)local_88._0_4_);
    if (0 < (int)local_88._0_4_) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        __s = (char *)(**(code **)(lVar6 + 0xa80))(0x1f03);
        lVar1 = *(long *)local_90;
        pcVar5 = *(char **)(lVar1 + 8 + lVar7);
        strlen(__s);
        std::__cxx11::string::_M_replace(lVar1 + lVar7,0,pcVar5,(ulong)__s);
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0x20;
      } while (lVar8 < (int)local_88._0_4_);
    }
    dVar4 = (**(code **)(lVar6 + 0x800))();
    checkError(dVar4,"glGetStringi(GL_EXTENSIONS, ndx) failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluContextInfo.cpp"
               ,0xcf);
  }
  return;
}

Assistant:

ContextInfo::ContextInfo (const RenderContext& context)
	: m_context(context)
{
	const glw::Functions& gl = context.getFunctions();

	if (context.getType().getAPI() == ApiType::es(2,0))
	{
		const char* result = (const char*)gl.getString(GL_EXTENSIONS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetString(GL_EXTENSIONS) failed");

		split(m_extensions, string(result));
	}
	else
	{
		int				numExtensions	= 0;

		gl.getIntegerv(GL_NUM_EXTENSIONS, &numExtensions);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_NUM_EXTENSIONS) failed");

		m_extensions.resize(numExtensions);
		for (int ndx = 0; ndx < numExtensions; ndx++)
			m_extensions[ndx] = (const char*)gl.getStringi(GL_EXTENSIONS, ndx);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetStringi(GL_EXTENSIONS, ndx) failed");
	}
}